

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

bool __thiscall
dxil_spv::CFGStructurizer::block_is_load_bearing(CFGStructurizer *this,CFGNode *node,CFGNode *merge)

{
  pointer ppOVar1;
  bool bVar2;
  bool bVar3;
  pointer ppOVar4;
  
  do {
    if ((long)(merge->succ).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(merge->succ).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start != 8) break;
    bVar2 = merge_candidate_is_on_breaking_path(this,merge);
    if ((bVar2) &&
       (ppOVar4 = (merge->ir).operations.
                  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       ppOVar4 !=
       (merge->ir).operations.
       super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
       ._M_impl.super__Vector_impl_data._M_finish)) {
      ppOVar1 = (merge->ir).operations.
                super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      bVar2 = ppOVar4 != ppOVar1;
      if (bVar2) {
        bVar3 = SPIRVModule::opcode_is_control_dependent((*ppOVar4)->op);
        while (!bVar3) {
          ppOVar4 = ppOVar4 + 1;
          bVar2 = ppOVar4 != ppOVar1;
          if (ppOVar4 == ppOVar1) break;
          bVar3 = SPIRVModule::opcode_is_control_dependent((*ppOVar4)->op);
        }
      }
      if (bVar2) goto LAB_0013bc56;
      merge = *(merge->succ).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = true;
    }
    else {
LAB_0013bc56:
      bVar2 = false;
    }
  } while (bVar2);
  if ((ulong)((long)(node->pred).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(node->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 9) {
    bVar2 = false;
  }
  else {
    bVar2 = exists_path_in_cfg_without_intermediate_node(this,node->immediate_dominator,merge,node);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool CFGStructurizer::block_is_load_bearing(const CFGNode *node, const CFGNode *merge) const
{
	while (merge->succ.size() == 1)
	{
		// If we're going to eliminate a block due to impossible merge,
		// we should look ahead since we might get a false positive.
		bool breaking = merge_candidate_is_on_breaking_path(merge);
		if (breaking && !merge->ir.operations.empty() && !block_is_control_dependent(merge))
			merge = merge->succ.front();
		else
			break;
	}

	return node->pred.size() >= 2 &&
	       !exists_path_in_cfg_without_intermediate_node(node->immediate_dominator, merge, node);
}